

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall chrono::ChOptimizerGenetic::LogOut(ChOptimizerGenetic *this,bool filelog)

{
  undefined4 uVar1;
  ChVectorDynamic<> *pCVar2;
  long lVar3;
  ChLog *pCVar4;
  
  pCVar2 = this->his_average;
  if ((pCVar2 != (ChVectorDynamic<> *)0x0) &&
     (lVar3 = this->generations_done,
     lVar3 <= (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows)) {
    if (lVar3 < 1) goto LAB_007ce9e0;
    (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [lVar3 + -1] = this->average;
  }
  pCVar2 = this->his_stdeviation;
  if ((pCVar2 != (ChVectorDynamic<> *)0x0) &&
     (lVar3 = this->generations_done,
     lVar3 <= (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows)) {
    if (lVar3 < 1) goto LAB_007ce9e0;
    (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [lVar3 + -1] = this->stdeviation;
  }
  pCVar2 = this->his_maxfitness;
  if ((pCVar2 != (ChVectorDynamic<> *)0x0) &&
     (lVar3 = this->generations_done,
     lVar3 <= (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows)) {
    if (lVar3 < 1) goto LAB_007ce9e0;
    (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [lVar3 + -1] = this->max_fitness;
  }
  pCVar2 = this->his_minfitness;
  if ((pCVar2 != (ChVectorDynamic<> *)0x0) &&
     (lVar3 = this->generations_done,
     lVar3 <= (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows)) {
    if (lVar3 < 1) {
LAB_007ce9e0:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    (pCVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [lVar3 + -1] = this->min_fitness;
  }
  if (filelog) {
    pCVar4 = GetLog();
    uVar1 = *(undefined4 *)&(pCVar4->super_ChStreamOutAscii).field_0x1c;
    pCVar4 = GetLog();
    *(undefined4 *)&(pCVar4->super_ChStreamOutAscii).field_0x1c = 2;
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,"\n\nGENERATION ------- n. ");
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,(int)this->generations_done);
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,"\n  STATISTICS:");
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,"\n     max:   ");
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,this->max_fitness);
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,"\n     min:   ");
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,this->min_fitness);
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,"\n     media: ");
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,this->average);
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,"\n     stdev: ");
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,this->stdeviation);
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<
              (&pCVar4->super_ChStreamOutAscii,"\n  Fitness of best individual ever born: ");
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,this->best_indiv->fitness);
    pCVar4 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar4->super_ChStreamOutAscii,"\n");
    pCVar4 = GetLog();
    *(undefined4 *)&(pCVar4->super_ChStreamOutAscii).field_0x1c = uVar1;
  }
  return;
}

Assistant:

void ChOptimizerGenetic::LogOut(bool filelog) {
    if (his_average && his_average->size() >= generations_done)
        (*his_average)(generations_done - 1) = average;
    if (his_stdeviation && his_stdeviation->size() >= generations_done)
        (*his_stdeviation)(generations_done - 1) = stdeviation;
    if (his_maxfitness && his_maxfitness->size() >= generations_done)
        (*his_maxfitness)(generations_done - 1) = max_fitness;
    if (his_minfitness && his_minfitness->size() >= generations_done)
        (*his_minfitness)(generations_done - 1) = min_fitness;

    if (filelog) {
        ChLog::eChLogLevel oldfilemode = GetLog().GetCurrentLevel();
        GetLog().SetCurrentLevel(ChLog::CHMESSAGE);

        GetLog() << "\n\nGENERATION ------- n. ";
        GetLog() << (int)generations_done;
        GetLog() << "\n  STATISTICS:";
        GetLog() << "\n     max:   ";
        GetLog() << max_fitness;
        GetLog() << "\n     min:   ";
        GetLog() << min_fitness;
        GetLog() << "\n     media: ";
        GetLog() << average;
        GetLog() << "\n     stdev: ";
        GetLog() << stdeviation;
        GetLog() << "\n  Fitness of best individual ever born: ";
        GetLog() << best_indiv->fitness;
        GetLog() << "\n";

        GetLog().SetCurrentLevel(oldfilemode);
    }
}